

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O2

void __thiscall MIDISong2::DoRestart(MIDISong2 *this)

{
  int iVar1;
  DWORD DVar2;
  TrackInfo *pTVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = this->NumTracks;
  piVar4 = &this->Tracks->LoopCount;
  for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
    *(size_t *)(piVar4 + -0xb) = 0;
    *(undefined2 *)(piVar4 + -5) = 0;
    *(bool *)((long)piVar4 + -0x12) = false;
    *(WORD *)((long)piVar4 + -0xe) = 0;
    *piVar4 = -1;
    *(undefined2 *)((long)piVar4 + -0x11) = 0;
    piVar4[-6] = 0;
    piVar4 = piVar4 + 0x10;
  }
  ProcessInitialMetaEvents(this);
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < this->NumTracks; lVar6 = lVar6 + 1) {
    DVar2 = TrackInfo::ReadVarLen((TrackInfo *)((long)&this->Tracks->TrackBegin + lVar5));
    *(DWORD *)((long)&this->Tracks->Delay + lVar5) = DVar2;
    lVar5 = lVar5 + 0x40;
  }
  this->TrackDue = this->Tracks;
  pTVar3 = FindNextDue(this);
  this->TrackDue = pTVar3;
  return;
}

Assistant:

void MIDISong2 :: DoRestart()
{
	int i;

	// Set initial state.
	for (i = 0; i < NumTracks; ++i)
	{
		Tracks[i].TrackP = 0;
		Tracks[i].Finished = false;
		Tracks[i].RunningStatus = 0;
		Tracks[i].Designated = false;
		Tracks[i].Designation = 0;
		Tracks[i].LoopCount = -1;
		Tracks[i].EProgramChange = false;
		Tracks[i].EVolume = false;
		Tracks[i].PlayedTime = 0;
	}
	ProcessInitialMetaEvents ();
	for (i = 0; i < NumTracks; ++i)
	{
		Tracks[i].Delay = Tracks[i].ReadVarLen();
	}
	TrackDue = Tracks;
	TrackDue = FindNextDue();
}